

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::CordRepBtree::ExtractFront(CordRepBtree *tree)

{
  bool bVar1;
  size_t sVar2;
  CordRep *rep;
  size_t end;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar3;
  CordRepBtree *local_28;
  CordRep *front;
  CordRepBtree *tree_local;
  
  sVar2 = begin(tree);
  rep = Edge(tree,sVar2);
  bVar1 = RefcountAndFlags::IsOne(&(tree->super_CordRep).refcount);
  if (bVar1) {
    sVar2 = begin(tree);
    end = CordRepBtree::end(tree);
    SVar3 = Edges(tree,sVar2 + 1,end);
    local_28 = (CordRepBtree *)SVar3.ptr_;
    SVar3.ptr_ = SVar3.len_;
    Unref(local_28,SVar3);
    Delete(tree);
  }
  else {
    CordRep::Ref(rep);
    CordRep::Unref(&tree->super_CordRep);
  }
  return rep;
}

Assistant:

CordRep* CordRepBtree::ExtractFront(CordRepBtree* tree) {
  CordRep* front = tree->Edge(tree->begin());
  if (tree->refcount.IsOne()) {
    Unref(tree->Edges(tree->begin() + 1, tree->end()));
    CordRepBtree::Delete(tree);
  } else {
    CordRep::Ref(front);
    CordRep::Unref(tree);
  }
  return front;
}